

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  long lVar1;
  type_conflict5 tVar2;
  char *pcVar3;
  int *piVar4;
  IdxElement *pIVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 in_RSI;
  long in_RDI;
  int i_1;
  int i;
  IdxElement price;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int nsorted;
  int idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *weights_ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *test;
  undefined1 in_stack_0000026f;
  int in_stack_00000270;
  int in_stack_00000274;
  int in_stack_00000278;
  int in_stack_0000027c;
  IdxCompare *in_stack_00000280;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  IdxElement *in_stack_00000288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  int in_stack_000002a0;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar7;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffd54;
  int i_00;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd68;
  int local_264;
  undefined1 local_260 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  undefined1 local_1f0 [56];
  undefined1 local_1b8 [56];
  undefined1 local_180 [56];
  uint local_148;
  int local_144;
  undefined1 auStack_140 [56];
  undefined1 local_108 [56];
  int local_d0;
  int local_cc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 local_b0;
  DataKey local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_b0 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           **)(in_RDI + 0x10));
  local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x37f562);
  local_c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x37f582);
  local_98 = local_108;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::IdxElement
            ((IdxElement *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::clear((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           *)0x37f5c5);
  IdxSet::clear((IdxSet *)(in_RDI + 0x158));
  local_148 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0xc98));
  uVar6 = extraout_RDX;
  while (local_148 = local_148 - 1, -1 < (int)local_148) {
    pcVar3 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0xc98),(char *)(ulong)local_148,
                           (int)uVar6);
    local_cc = (int)pcVar3;
    local_40 = local_c0 + local_cc;
    local_38 = local_108;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_20 = local_180;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,in_RDX);
    local_10 = local_180;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_8 = local_180;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x37f703);
    if (tVar2) {
      piVar4 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0xd10),local_cc);
      *piVar4 = 1;
      local_88 = local_1f0;
      local_90 = local_108;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_80 = local_c8 + local_cc;
      local_78 = &stack0xfffffffffffffdd8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_68 = local_260;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_58 = auStack_140;
      local_60 = local_1b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_144 = local_cc;
      Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
      ::append((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (IdxElement *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      uVar6 = extraout_RDX_00;
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0xc98),(char *)(ulong)local_148);
      piVar4 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0xd10),local_cc);
      *piVar4 = 0;
      uVar6 = extraout_RDX_01;
    }
  }
  pIVar5 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           ::get_const_ptr((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                            *)0x37f8c1);
  *(IdxElement **)(in_RDI + 0x60) = pIVar5;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::get_ptr((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             *)0x37f8d6);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::size((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
          *)0x37f8f8);
  uVar7 = 0;
  uVar8 = 1;
  local_d0 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                       (in_stack_00000288,in_stack_00000280,in_stack_0000027c,in_stack_00000278,
                        in_stack_00000274,in_stack_00000270,in_stack_000002a0,
                        (bool)in_stack_0000026f);
  for (local_264 = 0; local_264 < local_d0; local_264 = local_264 + 1) {
    in_stack_fffffffffffffd68 =
         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x158);
    Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
    ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                  *)CONCAT44(in_stack_fffffffffffffd54,uVar8),in_stack_fffffffffffffd4c);
    DIdxSet::addIdx((DIdxSet *)CONCAT44(in_stack_fffffffffffffd54,uVar8),in_stack_fffffffffffffd4c);
    lVar1 = *(long *)(in_RDI + 0x10);
    pIVar5 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                           *)CONCAT44(in_stack_fffffffffffffd54,uVar8),in_stack_fffffffffffffd4c);
    piVar4 = DataArray<int>::operator[]((DataArray<int> *)(lVar1 + 0xd10),pIVar5->idx);
    *piVar4 = 2;
  }
  if (local_d0 < 1) {
    SPxId::SPxId((SPxId *)0x37fa3f);
  }
  else {
    pIVar5 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                           *)CONCAT44(in_stack_fffffffffffffd54,uVar8),in_stack_fffffffffffffd4c);
    local_50 = &pIVar5->val;
    local_48 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_fffffffffffffd54,uVar8),
               (cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_fffffffffffffd4c,uVar7));
    i_00 = (int)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
    Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
    ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                  *)CONCAT44(in_stack_fffffffffffffd54,uVar8),in_stack_fffffffffffffd4c);
    local_a0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id(in_stack_fffffffffffffd68,i_00);
  }
  return (SPxId)local_a0;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, weights_ptr[idx], feastol);
         price.idx = idx;
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}